

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O2

double BeliefValue::GetValue(BeliefInterface *Belief,ValueFunctionPOMDPDiscrete *V)

{
  pointer pAVar1;
  uint uVar2;
  long lVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  auVar5 = ZEXT816(0xffefffffffffffff);
  uVar2 = 0;
  while( true ) {
    pAVar1 = (V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(V->super__Vector_base<AlphaVector,_std::allocator<AlphaVector>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pAVar1;
    dVar4 = auVar5._0_8_;
    if (lVar3 / 0x28 == (ulong)uVar2) break;
    (*Belief->_vptr_BeliefInterface[0x10])(Belief,&pAVar1[uVar2]._m_values,lVar3 % 0x28);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar4;
    uVar2 = uVar2 + 1;
    auVar6 = vmaxsd_avx(auVar5,auVar6);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = auVar6._0_8_;
  }
  return dVar4;
}

Assistant:

double BeliefValue::GetValue(const BeliefInterface &Belief,
                             const ValueFunctionPOMDPDiscrete &V)
{
    double x,maxVal=-DBL_MAX;

    for(unsigned int i=0;i!=V.size();i++)
    {
        // compute inner product of belief with vector
        x=Belief.InnerProduct(V[i].GetValues());
        
        // keep the maximizing value
        if(x>maxVal)
            maxVal=x;
    }

    return(maxVal);    
}